

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void adjust_param_type(c2m_ctx_t c2m_ctx,type **type_ptr)

{
  type *ptVar1;
  type *type_00;
  type *ptVar2;
  arr_type *arr_type;
  type *type;
  type *par_type;
  type **type_ptr_local;
  c2m_ctx_t c2m_ctx_local;
  
  ptVar1 = *type_ptr;
  if (ptVar1->mode == TM_ARR) {
    ptVar2 = (ptVar1->u).ptr_type;
    type_00 = create_type(c2m_ctx,(type *)0x0);
    type_00->mode = TM_PTR;
    type_00->pos_node = ptVar1->pos_node;
    type_00->u = (anon_union_8_5_3fbb1736_for_u)ptVar2->arr_type;
    type_00->type_qual = (type_qual)ptVar2->antialias;
    type_00->arr_type = ptVar1;
    *type_ptr = type_00;
    make_type_complete(c2m_ctx,type_00);
  }
  else if (ptVar1->mode == TM_FUNC) {
    ptVar2 = create_type(c2m_ctx,(type *)0x0);
    ptVar2->mode = TM_PTR;
    ptVar2->pos_node = ptVar1->pos_node;
    ptVar2->func_type_before_adjustment_p = '\x01';
    (ptVar2->u).ptr_type = ptVar1;
    *type_ptr = ptVar2;
    make_type_complete(c2m_ctx,ptVar2);
  }
  return;
}

Assistant:

static void adjust_param_type (c2m_ctx_t c2m_ctx, struct type **type_ptr) {
  struct type *par_type, *type = *type_ptr;
  struct arr_type *arr_type;

  if (type->mode == TM_ARR) {  // ??? static, old type qual
    arr_type = type->u.arr_type;
    par_type = create_type (c2m_ctx, NULL);
    par_type->mode = TM_PTR;
    par_type->pos_node = type->pos_node;
    par_type->u.ptr_type = arr_type->el_type;
    par_type->type_qual = arr_type->ind_type_qual;
    par_type->arr_type = type;
    *type_ptr = type = par_type;
    make_type_complete (c2m_ctx, type);
  } else if (type->mode == TM_FUNC) {
    par_type = create_type (c2m_ctx, NULL);
    par_type->mode = TM_PTR;
    par_type->pos_node = type->pos_node;
    par_type->func_type_before_adjustment_p = TRUE;
    par_type->u.ptr_type = type;
    *type_ptr = type = par_type;
    make_type_complete (c2m_ctx, type);
  }
}